

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O3

CURLcode auth_create_digest_http_message
                   (Curl_easy *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen,
                   _func_void_uchar_ptr_uchar_ptr *convert_to_ascii,
                   _func_CURLcode_uchar_ptr_uchar_ptr_size_t *hash)

{
  int iVar1;
  CURLcode CVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar *puVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *cnonce;
  uchar *local_198;
  size_t cnonce_sz;
  uchar hashbuf [32];
  uchar ha1 [65];
  uchar request_digest [65];
  char userh [65];
  uchar ha2 [65];
  
  cnonce = (char *)0x0;
  cnonce_sz = 0;
  if (digest->nc == 0) {
    digest->nc = 1;
  }
  if (digest->cnonce == (char *)0x0) {
    CVar2 = Curl_rand_hex(data,request_digest,0x21);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    sVar4 = strlen((char *)request_digest);
    CVar2 = Curl_base64_encode((char *)request_digest,sVar4,&cnonce,&cnonce_sz);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    digest->cnonce = cnonce;
  }
  local_198 = request;
  if ((digest->field_0x35 & 2) != 0) {
    pcVar6 = "";
    if (digest->realm != (char *)0x0) {
      pcVar6 = digest->realm;
    }
    puVar3 = (uchar *)curl_maprintf("%s:%s",userp,pcVar6);
    if (puVar3 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    sVar4 = strlen((char *)puVar3);
    (*hash)(hashbuf,puVar3,sVar4);
    (*Curl_cfree)(puVar3);
    (*convert_to_ascii)(hashbuf,(uchar *)userh);
  }
  pcVar6 = "";
  if (digest->realm != (char *)0x0) {
    pcVar6 = digest->realm;
  }
  puVar3 = (uchar *)curl_maprintf("%s:%s:%s",userp,pcVar6,passwdp);
  if (puVar3 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  sVar4 = strlen((char *)puVar3);
  (*hash)(hashbuf,puVar3,sVar4);
  (*Curl_cfree)(puVar3);
  (*convert_to_ascii)(hashbuf,ha1);
  if ((digest->algo & 1) != 0) {
    puVar3 = (uchar *)curl_maprintf("%s:%s:%s",ha1,digest->nonce,digest->cnonce);
    if (puVar3 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    sVar4 = strlen((char *)puVar3);
    (*hash)(hashbuf,puVar3,sVar4);
    (*Curl_cfree)(puVar3);
    (*convert_to_ascii)(hashbuf,ha1);
  }
  puVar3 = (uchar *)curl_maprintf("%s:%s",local_198,uripath);
  if (puVar3 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((digest->qop != (char *)0x0) &&
     (iVar1 = Curl_strcasecompare(digest->qop,"auth-int"), iVar1 != 0)) {
    (*hash)(hashbuf,"",0);
    (*convert_to_ascii)(hashbuf,request_digest);
    puVar5 = (uchar *)curl_maprintf("%s:%s",puVar3,request_digest);
    (*Curl_cfree)(puVar3);
    puVar3 = puVar5;
    if (puVar5 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  sVar4 = strlen((char *)puVar3);
  (*hash)(hashbuf,puVar3,sVar4);
  (*Curl_cfree)(puVar3);
  (*convert_to_ascii)(hashbuf,ha2);
  if (digest->qop == (char *)0x0) {
    puVar3 = (uchar *)curl_maprintf("%s:%s:%s",ha1,digest->nonce,ha2);
  }
  else {
    puVar3 = (uchar *)curl_maprintf("%s:%s:%08x:%s:%s:%s",ha1,digest->nonce,(ulong)(uint)digest->nc,
                                    digest->cnonce,digest->qop,ha2);
  }
  if (puVar3 == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  sVar4 = strlen((char *)puVar3);
  (*hash)(hashbuf,puVar3,sVar4);
  (*Curl_cfree)(puVar3);
  (*convert_to_ascii)(hashbuf,request_digest);
  pcVar6 = userh;
  if ((digest->field_0x35 & 2) == 0) {
    pcVar6 = userp;
  }
  pcVar6 = auth_digest_string_quoted(pcVar6);
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar9 = pcVar6;
  if (digest->realm == (char *)0x0) {
    pcVar7 = (char *)(*Curl_cmalloc)(1);
    if (pcVar7 == (char *)0x0) goto LAB_0012615f;
    *pcVar7 = '\0';
  }
  else {
    pcVar7 = auth_digest_string_quoted(digest->realm);
    if (pcVar7 == (char *)0x0) goto LAB_0012615f;
  }
  pcVar8 = auth_digest_string_quoted(digest->nonce);
  if (pcVar8 == (char *)0x0) {
    (*Curl_cfree)(pcVar7);
    (*Curl_cfree)(pcVar6);
    return CURLE_OUT_OF_MEMORY;
  }
  if (digest->qop == (char *)0x0) {
    pcVar9 = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", response=\"%s\""
                           ,pcVar6,pcVar7,pcVar8,uripath,request_digest);
  }
  else {
    pcVar9 = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                           ,pcVar6,pcVar7,pcVar8,uripath,digest->cnonce,(ulong)(uint)digest->nc,
                           digest->qop,request_digest);
    digest->nc = digest->nc + 1;
  }
  (*Curl_cfree)(pcVar8);
  (*Curl_cfree)(pcVar7);
  (*Curl_cfree)(pcVar6);
  if (pcVar9 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar6 = pcVar9;
  if (digest->opaque != (char *)0x0) {
    pcVar7 = auth_digest_string_quoted(digest->opaque);
    if (pcVar7 == (char *)0x0) {
LAB_0012615f:
      (*Curl_cfree)(pcVar9);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar6 = curl_maprintf("%s, opaque=\"%s\"",pcVar9,pcVar7);
    (*Curl_cfree)(pcVar9);
    (*Curl_cfree)(pcVar7);
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pcVar9 = pcVar6;
  if (digest->algorithm != (char *)0x0) {
    pcVar9 = curl_maprintf("%s, algorithm=%s",pcVar6);
    (*Curl_cfree)(pcVar6);
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pcVar6 = pcVar9;
  if ((digest->field_0x35 & 2) != 0) {
    pcVar6 = curl_maprintf("%s, userhash=true",pcVar9);
    (*Curl_cfree)(pcVar9);
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *outptr = pcVar6;
  sVar4 = strlen(pcVar6);
  *outlen = sVar4;
  return CURLE_OK;
}

Assistant:

static CURLcode auth_create_digest_http_message(
                  struct Curl_easy *data,
                  const char *userp,
                  const char *passwdp,
                  const unsigned char *request,
                  const unsigned char *uripath,
                  struct digestdata *digest,
                  char **outptr, size_t *outlen,
                  void (*convert_to_ascii)(unsigned char *, unsigned char *),
                  CURLcode (*hash)(unsigned char *, const unsigned char *,
                                   const size_t))
{
  CURLcode result;
  unsigned char hashbuf[32]; /* 32 bytes/256 bits */
  unsigned char request_digest[65];
  unsigned char ha1[65];    /* 64 digits and 1 zero byte */
  unsigned char ha2[65];    /* 64 digits and 1 zero byte */
  char userh[65];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *userp_quoted;
  char *realm_quoted;
  char *nonce_quoted;
  char *response = NULL;
  char *hashthis = NULL;
  char *tmp = NULL;

  if(!digest->nc)
    digest->nc = 1;

  if(!digest->cnonce) {
    char cnoncebuf[33];
    result = Curl_rand_hex(data, (unsigned char *)cnoncebuf,
                           sizeof(cnoncebuf));
    if(result)
      return result;

    result = Curl_base64_encode(cnoncebuf, strlen(cnoncebuf),
                                &cnonce, &cnonce_sz);
    if(result)
      return result;

    digest->cnonce = cnonce;
  }

  if(digest->userhash) {
    hashthis = aprintf("%s:%s", userp, digest->realm ? digest->realm : "");
    if(!hashthis)
      return CURLE_OUT_OF_MEMORY;

    hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
    free(hashthis);
    convert_to_ascii(hashbuf, (unsigned char *)userh);
  }

  /*
    If the algorithm is "MD5" or unspecified (which then defaults to MD5):

      A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    If the algorithm is "MD5-sess" then:

      A1 = H(unq(username-value) ":" unq(realm-value) ":" passwd) ":"
           unq(nonce-value) ":" unq(cnonce-value)
  */

  hashthis = aprintf("%s:%s:%s", userp, digest->realm ? digest->realm : "",
                     passwdp);
  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
  free(hashthis);
  convert_to_ascii(hashbuf, ha1);

  if(digest->algo & SESSION_ALGO) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, digest->nonce, digest->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    hash(hashbuf, (unsigned char *) tmp, strlen(tmp));
    free(tmp);
    convert_to_ascii(hashbuf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2 = Method ":" digest-uri-value

    If the "qop" value is "auth-int", then A2 is:

      A2 = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  hashthis = aprintf("%s:%s", request, uripath);
  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  if(digest->qop && strcasecompare(digest->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST */
    char hashed[65];
    char *hashthis2;

    hash(hashbuf, (const unsigned char *)"", 0);
    convert_to_ascii(hashbuf, (unsigned char *)hashed);

    hashthis2 = aprintf("%s:%s", hashthis, hashed);
    free(hashthis);
    hashthis = hashthis2;
  }

  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
  free(hashthis);
  convert_to_ascii(hashbuf, ha2);

  if(digest->qop) {
    hashthis = aprintf("%s:%s:%08x:%s:%s:%s", ha1, digest->nonce, digest->nc,
                       digest->cnonce, digest->qop, ha2);
  }
  else {
    hashthis = aprintf("%s:%s:%s", ha1, digest->nonce, ha2);
  }

  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
  free(hashthis);
  convert_to_ascii(hashbuf, request_digest);

  /* For test case 64 (snooped from a Mozilla 1.3a request)

     Authorization: Digest username="testuser", realm="testrealm", \
     nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

     Digest parameters are all quoted strings.  Username which is provided by
     the user will need double quotes and backslashes within it escaped.
     realm, nonce, and opaque will need backslashes as well as they were
     de-escaped when copied from request header.  cnonce is generated with
     web-safe characters.  uri is already percent encoded.  nc is 8 hex
     characters.  algorithm and qop with standard values only contain web-safe
     characters.
  */
  userp_quoted = auth_digest_string_quoted(digest->userhash ? userh : userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;
  if(digest->realm)
    realm_quoted = auth_digest_string_quoted(digest->realm);
  else {
    realm_quoted = malloc(1);
    if(realm_quoted)
      realm_quoted[0] = 0;
  }
  if(!realm_quoted) {
    free(userp_quoted);
    return CURLE_OUT_OF_MEMORY;
  }
  nonce_quoted = auth_digest_string_quoted(digest->nonce);
  if(!nonce_quoted) {
    free(realm_quoted);
    free(userp_quoted);
    return CURLE_OUT_OF_MEMORY;
  }

  if(digest->qop) {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "cnonce=\"%s\", "
                       "nc=%08x, "
                       "qop=%s, "
                       "response=\"%s\"",
                       userp_quoted,
                       realm_quoted,
                       nonce_quoted,
                       uripath,
                       digest->cnonce,
                       digest->nc,
                       digest->qop,
                       request_digest);

    /* Increment nonce-count to use another nc value for the next request */
    digest->nc++;
  }
  else {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "response=\"%s\"",
                       userp_quoted,
                       realm_quoted,
                       nonce_quoted,
                       uripath,
                       request_digest);
  }
  free(nonce_quoted);
  free(realm_quoted);
  free(userp_quoted);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Add the optional fields */
  if(digest->opaque) {
    char *opaque_quoted;
    /* Append the opaque */
    opaque_quoted = auth_digest_string_quoted(digest->opaque);
    if(!opaque_quoted) {
      free(response);
      return CURLE_OUT_OF_MEMORY;
    }
    tmp = aprintf("%s, opaque=\"%s\"", response, opaque_quoted);
    free(response);
    free(opaque_quoted);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->algorithm) {
    /* Append the algorithm */
    tmp = aprintf("%s, algorithm=%s", response, digest->algorithm);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->userhash) {
    /* Append the userhash */
    tmp = aprintf("%s, userhash=true", response);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  /* Return the output */
  *outptr = response;
  *outlen = strlen(response);

  return CURLE_OK;
}